

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

ConstantValue * __thiscall
(anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>
          (ConstantValue *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryOperator op,
          SVInt *l,bool *r)

{
  logic_t lVar1;
  byte value;
  logic_error *this_00;
  undefined4 in_register_00000014;
  SVInt *lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lhs = (SVInt *)CONCAT44(in_register_00000014,op);
  switch((int)this) {
  case 0x13:
    lVar1 = slang::SVInt::reductionOr(lhs);
    value = (lVar1.value != '\0' && (lVar1.value != '@' && lVar1.value != 0x80)) &
            *(byte *)&(l->super_SVIntStorage).field_0;
    break;
  case 0x14:
    lVar1 = slang::SVInt::reductionOr(lhs);
    value = (lVar1.value != '\0' && (lVar1.value != '@' && lVar1.value != 0x80)) |
            *(byte *)&(l->super_SVIntStorage).field_0;
    break;
  case 0x15:
    slang::SVInt::SVInt<bool,void>((SVInt *)&local_e0,*(bool *)&(l->super_SVIntStorage).field_0);
    lVar1 = slang::SVInt::logicalImpl(lhs,(SVInt *)&local_e0);
    slang::SVInt::SVInt((SVInt *)&local_c0,lVar1);
    goto LAB_003233d6;
  case 0x16:
    slang::SVInt::SVInt<bool,void>((SVInt *)&local_e0,*(bool *)&(l->super_SVIntStorage).field_0);
    lVar1 = slang::SVInt::logicalEquiv(lhs,(SVInt *)&local_e0);
    slang::SVInt::SVInt((SVInt *)&local_c0,lVar1);
LAB_003233d6:
    std::
    variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
    ::variant<slang::SVInt,void,void,slang::SVInt,void>
              ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                *)__return_storage_ptr__,(SVInt *)&local_c0);
    slang::SVInt::~SVInt((SVInt *)&local_c0);
    this_01 = &local_e0;
    goto LAB_0032343f;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_e1);
    std::operator+(&local_60,&local_80,":");
    std::__cxx11::to_string(&local_a0,0x2a);
    std::operator+(&local_40,&local_60,&local_a0);
    std::operator+(&local_e0,&local_40,": ");
    std::operator+(&local_c0,&local_e0,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_c0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = &local_c0;
  slang::SVInt::SVInt<bool,void>((SVInt *)this_01,(bool)value);
  std::
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  ::variant<slang::SVInt,void,void,slang::SVInt,void>
            ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              *)__return_storage_ptr__,(SVInt *)this_01);
LAB_0032343f:
  slang::SVInt::~SVInt((SVInt *)this_01);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue evalLogicalOp(BinaryOperator op, const TL& l, const TR& r) {
    switch (op) {
        OP(LogicalAnd, SVInt(logic_t(l) && r));
        OP(LogicalOr, SVInt(logic_t(l) || r));
        OP(LogicalImplication, SVInt(SVInt::logicalImpl(l, r)));
        OP(LogicalEquivalence, SVInt(SVInt::logicalEquiv(l, r)));
        default:
            ASSUME_UNREACHABLE;
    }
}